

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O0

USBSignalState * __thiscall
USBSignalFilter::GetState(USBSignalState *__return_storage_ptr__,USBSignalFilter *this)

{
  int iVar1;
  int iVar2;
  U64 UVar3;
  USBState UVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  USBState local_34;
  BitState dm_state;
  BitState dp_state;
  USBSignalFilter *this_local;
  
  __return_storage_ptr__->mSampleBegin = this->mStateStartSample;
  iVar1 = AnalyzerChannelData::GetBitState();
  iVar2 = AnalyzerChannelData::GetBitState();
  if (iVar1 == iVar2) {
    UVar4 = S_SE1;
    if (iVar1 == 0) {
      UVar4 = S_SE0;
    }
    __return_storage_ptr__->mState = UVar4;
  }
  else {
    if (this->mSpeed == LOW_SPEED) {
      bVar6 = iVar1 == 0;
    }
    else {
      bVar6 = iVar1 != 0;
    }
    local_34 = (USBState)bVar6;
    __return_storage_ptr__->mState = local_34;
  }
  UVar3 = DoFilter(this,this->mDP,this->mDM);
  this->mStateStartSample = UVar3;
  lVar5 = this->mStateStartSample - __return_storage_ptr__->mSampleBegin;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  __return_storage_ptr__->mDur =
       ((auVar7._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * this->mSampleDur;
  __return_storage_ptr__->mSampleEnd = this->mStateStartSample;
  return __return_storage_ptr__;
}

Assistant:

USBSignalState USBSignalFilter::GetState()
{
    USBSignalState ret_val;

    ret_val.mSampleBegin = mStateStartSample;

    // determine the USB signal state
    BitState dp_state = mDP->GetBitState();
    BitState dm_state = mDM->GetBitState();
    if( dp_state == dm_state )
        ret_val.mState = dp_state == BIT_LOW ? S_SE0 : S_SE1;
    else
        ret_val.mState = ( mSpeed == LOW_SPEED ? ( dp_state == BIT_LOW ? S_J : S_K ) : ( dp_state == BIT_LOW ? S_K : S_J ) );

    // do the filtering and remember the sample begin for the next iteration
    mStateStartSample = DoFilter( mDP, mDM );

    ret_val.mDur = ( mStateStartSample - ret_val.mSampleBegin ) * mSampleDur;
    ret_val.mSampleEnd = mStateStartSample;

    return ret_val;
}